

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

void rw::wdgl::packattrib(uint8 *dst,float32 *src,AttribDesc *a,float32 scale)

{
  int iVar1;
  long lVar2;
  float32 fVar3;
  
  switch(a->type) {
  case 0:
    memcpy(dst,src,(long)a->size << 2);
    return;
  case 1:
    if (0 < a->size) {
      lVar2 = 0;
      do {
        fVar3 = scale;
        if (a->normalized != 0) {
          fVar3 = 127.0;
        }
        dst[lVar2] = (uint8)(int)((float)fVar3 * (float)src[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < a->size);
    }
    break;
  case 2:
    if (0 < a->size) {
      lVar2 = 0;
      do {
        fVar3 = scale;
        if (a->normalized != 0) {
          fVar3 = 255.0;
        }
        dst[lVar2] = (uint8)(int)((float)fVar3 * (float)src[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < a->size);
    }
    break;
  case 3:
    iVar1 = a->size;
    if (0 < (long)iVar1) {
      if (a->normalized != 0) {
        scale = 32767.0;
      }
      lVar2 = 0;
      do {
        *(short *)(dst + lVar2 * 2) = (short)(int)((float)src[lVar2] * (float)scale);
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    break;
  case 4:
    iVar1 = a->size;
    if (0 < (long)iVar1) {
      if (a->normalized != 0) {
        scale = 65535.0;
      }
      lVar2 = 0;
      do {
        *(short *)(dst + lVar2 * 2) = (short)(int)((float)src[lVar2] * (float)scale);
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
  }
  return;
}

Assistant:

void
packattrib(uint8 *dst, float32 *src, AttribDesc *a, float32 scale=1.0f)
{
	int8 *i8dst;
	uint16 *u16dst;
	int16 *i16dst;

	switch(a->type){
	case 0:	// float
		memcpy(dst, src, a->size*4);
		break;

	// TODO: maybe have loop inside if?
	case 1: // byte
		i8dst = (int8*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				i8dst[i] = src[i]*scale;
			else
				i8dst[i] = src[i]*127.0f;
		}
		break;

	case 2: // ubyte
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = src[i]*scale;
			else
				dst[i] = src[i]*255.0f;
		}
		break;

	case 3: // short
		i16dst = (int16*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				i16dst[i] = src[i]*scale;
			else
				i16dst[i] = src[i]*32767.0f;
		}
		break;

	case 4: // ushort
		u16dst = (uint16*)dst;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				u16dst[i] = src[i]*scale;
			else
				u16dst[i] = src[i]*65535.0f;
		}
		break;
	}
}